

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_ManBoxNumRec(Cba_Man_t *p,int *pnPrims,int *pnUsers)

{
  int iVar1;
  Cba_Ntk_t *p_00;
  int *pCountP_00;
  int *pCountU_00;
  int *pCountU;
  int *pCountP;
  Cba_Ntk_t *pNtk;
  int *pnUsers_local;
  int *pnPrims_local;
  Cba_Man_t *p_local;
  
  p_00 = Cba_ManRoot(p);
  iVar1 = Cba_ManNtkNum(p);
  pCountP_00 = (int *)malloc((long)(iVar1 + 1) << 2);
  iVar1 = Cba_ManNtkNum(p);
  memset(pCountP_00,0xff,(long)(iVar1 + 1) << 2);
  iVar1 = Cba_ManNtkNum(p);
  pCountU_00 = (int *)malloc((long)(iVar1 + 1) << 2);
  iVar1 = Cba_ManNtkNum(p);
  memset(pCountU_00,0xff,(long)(iVar1 + 1) << 2);
  Cba_ManBoxNumRec_rec(p_00,pCountP_00,pCountU_00);
  iVar1 = Cba_NtkId(p_00);
  *pnPrims = pCountP_00[iVar1];
  iVar1 = Cba_NtkId(p_00);
  *pnUsers = pCountU_00[iVar1];
  if (pCountP_00 != (int *)0x0) {
    free(pCountP_00);
  }
  if (pCountU_00 != (int *)0x0) {
    free(pCountU_00);
  }
  return;
}

Assistant:

static inline void Cba_ManBoxNumRec( Cba_Man_t * p, int * pnPrims, int * pnUsers )
{
    Cba_Ntk_t * pNtk = Cba_ManRoot(p);
    int * pCountP = ABC_FALLOC( int, Cba_ManNtkNum(p) + 1 );
    int * pCountU = ABC_FALLOC( int, Cba_ManNtkNum(p) + 1 );
    Cba_ManBoxNumRec_rec( pNtk, pCountP, pCountU );
    *pnPrims = pCountP[Cba_NtkId(pNtk)];
    *pnUsers = pCountU[Cba_NtkId(pNtk)];
    ABC_FREE( pCountP );
    ABC_FREE( pCountU );
}